

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void emulator_ticks_to_time(Ticks ticks,u32 *day,u32 *hr,u32 *min,u32 *sec,u32 *ms)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = ticks >> 0x19;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ticks >> 0x19) / 0x7d;
  *ms = SUB164(auVar1 * ZEXT816(0x20c49ba5e353f7d),8) +
        SUB164(auVar2 * ZEXT816(0x4189374bc6a7f0),8) * -1000;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = ticks >> 0x16;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = ticks / 0xf000000;
  *sec = (int)(ticks >> 0x16) + SUB164(auVar3 * ZEXT816(0x444444444444445),8) * -0x3c;
  *min = (int)(ticks / 0xf000000) + SUB164(auVar4 * ZEXT816(0x444444444444445),8) * -0x3c;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = ticks >> 0x1a;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (ticks >> 0x1a) / 0xe1;
  *hr = SUB164(auVar5 * ZEXT816(0x123456789abcdf1),8) +
        SUB164(auVar6 * ZEXT816(0xaaaaaaaaaaaaaab),8) * -0x18;
  *day = (u32)(ticks / 0x5460000000);
  return;
}

Assistant:

void emulator_ticks_to_time(Ticks ticks, u32* day, u32* hr, u32* min, u32* sec,
                            u32* ms) {
  u64 secs = ticks / CPU_TICKS_PER_SECOND;
  *ms = (secs / 1000) % 1000;
  *sec = secs % 60;
  *min = (secs / 60) % 60;
  *hr = (secs / (60 * 60)) % 24;
  *day = secs / (60 * 60 * 24);
}